

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

DBErrors __thiscall wallet::WalletBatch::LoadWallet(WalletBatch *this,CWallet *pwallet)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  bool bVar9;
  int iVar10;
  int parameters_1;
  DBErrors DVar11;
  long *plVar12;
  LegacyDataSPKM *this_00;
  _Rb_tree_node_base *p_Var13;
  LoadResult LVar14;
  LoadResult LVar15;
  LegacyScriptPubKeyMan *this_01;
  void *pvVar16;
  LoadResult LVar17;
  LoadResult LVar18;
  LoadResult LVar19;
  iterator iVar20;
  undefined8 uVar21;
  DBErrors DVar22;
  long *plVar23;
  long *plVar24;
  unsigned_long *value;
  DBErrors DVar25;
  long lVar26;
  key_type *__k;
  ulong uVar27;
  long in_FS_OFFSET;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int last_client;
  vector<uint256,_std::allocator<uint256>_> upgraded_txs;
  bool any_unordered;
  DataStream prefix;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock6;
  int num_ckeys;
  int nMinVersion;
  set<std::pair<OutputType,_bool>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
  seen_spks;
  CWallet *pCVar30;
  undefined7 in_stack_fffffffffffffd40;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> _Var31;
  WalletBatch *pWVar32;
  WalletBatch *pWVar33;
  int local_28c;
  undefined1 local_288 [16];
  long local_278;
  char local_269;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  _Any_data local_208;
  code *local_1f8;
  code *local_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *local_1d0;
  _Any_data local_1c8;
  code *local_1b8;
  code *local_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *local_190;
  _Any_data local_188;
  code *local_178;
  code *local_170;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  _Any_data local_148;
  code *local_138;
  code *local_130;
  long *local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  unique_lock<std::recursive_mutex> local_f8;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8 [2];
  long local_b8 [2];
  undefined1 local_a8 [8];
  undefined1 auStack_a0 [8];
  undefined1 local_98 [16];
  _Rb_tree_node_base *local_88;
  size_t local_80;
  undefined1 auStack_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  _Base_ptr local_48;
  size_t local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_269 = '\0';
  local_288 = (undefined1  [16])0x0;
  local_278 = 0;
  local_f8._M_device = &(pwallet->cs_wallet).super_recursive_mutex;
  local_f8._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_f8);
  local_28c = 0x46c6c;
  bVar8 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::VERSION_abi_cxx11_,&local_28c);
  iVar10 = CWallet::GetVersion(pwallet);
  CWallet::WalletLogPrintf<int,int>
            (pwallet,"Wallet file version = %d, last client version = %d\n",iVar10,local_28c);
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffff5c;
  _local_a8 = (_Any_data)(auVar4 << 0x20);
  pWVar32 = this;
  bVar9 = DatabaseBatch::Read<std::__cxx11::string,int>
                    ((this->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::MINVERSION_abi_cxx11_,(int *)local_a8);
  if (bVar9) {
    if ((int)local_a8._0_4_ < 0x297ad) {
      pwallet->nWalletVersion = local_a8._0_4_;
      goto LAB_001aca3d;
    }
LAB_001acf47:
    DVar11 = TOO_NEW;
  }
  else {
LAB_001aca3d:
    value = (unsigned_long *)local_a8;
    bVar9 = DatabaseBatch::Read<std::__cxx11::string,unsigned_long>
                      ((this->m_batch)._M_t.
                       super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                       .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &DBKeys::FLAGS_abi_cxx11_,value);
    if (bVar9) {
      bVar9 = CWallet::LoadWalletFlags(pwallet,(uint64_t)local_a8);
      if (!bVar9) {
        CWallet::WalletLogPrintf<>
                  (pwallet,
                   "Error reading wallet database: Unknown non-tolerable wallet flags found\n");
        goto LAB_001acf47;
      }
    }
    iVar10 = local_28c;
    _Var31._M_head_impl =
         (this->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
    bVar9 = CWallet::IsWalletFlagSet(pwallet,0x400000000);
    if (bVar9) {
      plVar23 = (long *)(DBKeys::LEGACY_TYPES_abi_cxx11_ + 0x10);
      do {
        plVar23 = (long *)*plVar23;
        if (plVar23 == (long *)0x0) {
          DVar25 = LOAD_OK;
          goto LAB_001ad216;
        }
        local_98 = (undefined1  [16])0x0;
        _local_a8 = (_Any_data)0x0;
        local_58 = (undefined1  [16])0x0;
        local_68 = (undefined1  [16])0x0;
        local_108 = (undefined1  [16])0x0;
        local_118 = (undefined1  [16])0x0;
        Serialize<DataStream,char>
                  ((DataStream *)local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (plVar23 + 1));
        (*(_Var31._M_head_impl)->_vptr_DatabaseBatch[10])
                  (&local_120,_Var31._M_head_impl,(_Invoker_type)(local_118._0_8_ + local_108._8_8_)
                   ,local_118._8_8_ - (long)(local_118._0_8_ + local_108._8_8_));
        if (local_120 == (long *)0x0) {
          local_c8[0] = local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_c8,plVar23[1],plVar23[2] + plVar23[1]);
          parameters_00._M_string_length._0_7_ = in_stack_fffffffffffffd40;
          parameters_00._M_dataplus._M_p = (pointer)pwallet;
          parameters_00._M_string_length._7_1_ = bVar8;
          parameters_00.field_2._M_allocated_capacity = (size_type)_Var31._M_head_impl;
          parameters_00.field_2._8_8_ = pWVar32;
          CWallet::WalletLogPrintf<std::__cxx11::string>
                    (pwallet,"Error getting database cursor for \'%s\' records\n",parameters_00);
          value = (unsigned_long *)0x9;
          plVar12 = local_b8;
          plVar24 = local_c8[0];
          if (local_c8[0] != plVar12) {
LAB_001acc20:
            operator_delete(plVar24,*plVar12 + 1);
          }
LAB_001acc2b:
          bVar9 = false;
        }
        else {
          iVar10 = (**(code **)(*local_120 + 0x10))
                             (local_120,
                              (_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
                              local_a8,(_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                        *)local_68);
          bVar9 = true;
          if (iVar10 != 2) {
            plVar12 = local_d8;
            pcVar3 = (pwallet->m_name)._M_dataplus._M_p;
            local_e8[0] = plVar12;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_e8,pcVar3,pcVar3 + (pwallet->m_name)._M_string_length);
            parameters._M_string_length._0_7_ = in_stack_fffffffffffffd40;
            parameters._M_dataplus._M_p = (pointer)pwallet;
            parameters._M_string_length._7_1_ = bVar8;
            parameters.field_2._M_allocated_capacity = (size_type)_Var31._M_head_impl;
            parameters.field_2._8_8_ = pWVar32;
            CWallet::WalletLogPrintf<std::__cxx11::string>
                      (pwallet,
                       "Error: Unexpected legacy entry found in descriptor wallet %s. The wallet might have been tampered with or created with malicious intent.\n"
                       ,parameters);
            value = (unsigned_long *)0x8;
            plVar24 = local_e8[0];
            if (local_e8[0] != plVar12) goto LAB_001acc20;
            goto LAB_001acc2b;
          }
        }
        DVar11 = (DBErrors)value;
        if (local_120 != (long *)0x0) {
          (**(code **)(*local_120 + 8))();
        }
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_118);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_68);
        std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                  ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_a8);
      } while (bVar9);
    }
    else {
      local_148 = (_Any_data)0x0;
      local_130 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                  ::_M_invoke;
      local_138 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:572:9)>
                  ::_M_manager;
      pCVar30 = pwallet;
      LVar17 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::HDCHAIN_abi_cxx11_,
                           (LoadFunc *)&local_148);
      if (local_138 != (code *)0x0) {
        (*local_138)(&local_148,&local_148,__destroy_functor);
      }
      local_168 = (_Any_data)0x0;
      local_150 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                  ::_M_invoke;
      local_158 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:579:9)>
                  ::_M_manager;
      LVar18 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::KEY_abi_cxx11_,
                           (LoadFunc *)&local_168);
      if (local_158 != (code *)0x0) {
        (*local_158)(&local_168,&local_168,__destroy_functor);
      }
      if ((int)LVar17.m_result <= (int)LVar18.m_result) {
        LVar17 = LVar18;
      }
      local_188 = (_Any_data)0x0;
      local_170 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                  ::_M_invoke;
      local_178 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:586:9)>
                  ::_M_manager;
      LVar19 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::CRYPTED_KEY_abi_cxx11_,
                           (LoadFunc *)&local_188);
      if (local_178 != (code *)0x0) {
        (*local_178)(&local_188,&local_188,__destroy_functor);
      }
      DVar25 = LVar17.m_result;
      if ((int)LVar17.m_result <= (int)LVar19.m_result) {
        DVar25 = LVar19.m_result;
      }
      local_1a8 = (_Any_data)0x0;
      local_190 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                  ::_M_invoke;
      local_198 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:593:9)>
                  ::_M_manager;
      LVar17 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::CSCRIPT_abi_cxx11_,
                           (LoadFunc *)&local_1a8);
      if (local_198 != (code *)0x0) {
        (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
      }
      DVar11 = LVar17.m_result;
      if ((int)LVar17.m_result < (int)DVar25) {
        DVar11 = DVar25;
      }
      DVar25 = LOAD_OK;
      if (0 < (int)DVar11) {
        DVar25 = DVar11;
      }
      parameters_1 = LVar19.m_records;
      if ((0 < parameters_1) &&
         (((iVar10 == 50000 || (iVar10 == 40000)) && (DVar25 = NEED_REWRITE, 2 < (int)DVar11)))) {
        DVar25 = DVar11;
      }
      auStack_a0._0_4_ = 0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (_Rb_tree_node_base *)auStack_a0;
      local_98 = auVar5 << 0x40;
      local_80 = 0;
      local_1c8._8_8_ = 0;
      local_1b0 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                  ::_M_invoke;
      local_1b8 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:616:9)>
                  ::_M_manager;
      local_1c8._M_unused._0_8_ = (undefined8)value;
      local_88 = (_Rb_tree_node_base *)auStack_a0;
      LVar17 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::KEYMETA_abi_cxx11_,
                           (LoadFunc *)&local_1c8);
      if (local_1b8 != (code *)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      if ((int)DVar25 <= (int)LVar17.m_result) {
        DVar25 = LVar17.m_result;
      }
      if (local_80 != 0) {
        this_00 = CWallet::GetLegacyDataSPKM(pCVar30);
        if (this_00 == (LegacyDataSPKM *)0x0) {
          DVar25 = CORRUPT;
          CWallet::WalletLogPrintf<>
                    (pCVar30,"Inactive HD Chains found but no Legacy ScriptPubKeyMan\n");
        }
        else {
          for (p_Var13 = (_Rb_tree_node_base *)local_98._8_8_;
              p_Var13 != (_Rb_tree_node_base *)auStack_a0;
              p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
            auVar28[0] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[0] == (char)p_Var13[1]._M_color);
            auVar28[1] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[1] == *(byte *)((long)&p_Var13[1]._M_color + 1));
            auVar28[2] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[2] == *(byte *)((long)&p_Var13[1]._M_color + 2));
            auVar28[3] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[3] == *(byte *)((long)&p_Var13[1]._M_color + 3));
            auVar28[4] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[4] == p_Var13[1].field_0x4);
            auVar28[5] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[5] == p_Var13[1].field_0x5);
            auVar28[6] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[6] == p_Var13[1].field_0x6);
            auVar28[7] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[7] == p_Var13[1].field_0x7);
            auVar28[8] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[8] == *(uchar *)&p_Var13[1]._M_parent);
            auVar28[9] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                           _M_elems[9] == *(uchar *)((long)&p_Var13[1]._M_parent + 1));
            auVar28[10] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data
                            ._M_elems[10] == *(uchar *)((long)&p_Var13[1]._M_parent + 2));
            auVar28[0xb] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xb] == *(uchar *)((long)&p_Var13[1]._M_parent + 3));
            auVar28[0xc] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xc] == *(uchar *)((long)&p_Var13[1]._M_parent + 4));
            auVar28[0xd] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xd] == *(uchar *)((long)&p_Var13[1]._M_parent + 5));
            auVar28[0xe] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xe] == *(uchar *)((long)&p_Var13[1]._M_parent + 6));
            auVar28[0xf] = -((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.
                             m_data._M_elems[0xf] == *(uchar *)((long)&p_Var13[1]._M_parent + 7));
            uVar1 = *(undefined4 *)&p_Var13[1]._M_left;
            uVar2 = *(undefined4 *)
                     ((this_00->m_hd_chain).seed_id.super_uint160.super_base_blob<160U>.m_data.
                      _M_elems + 0x10);
            auVar29[0] = -((char)uVar2 == (char)uVar1);
            auVar29[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
            auVar29[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
            auVar29[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
            auVar29[4] = 0xff;
            auVar29[5] = 0xff;
            auVar29[6] = 0xff;
            auVar29[7] = 0xff;
            auVar29[8] = 0xff;
            auVar29[9] = 0xff;
            auVar29[10] = 0xff;
            auVar29[0xb] = 0xff;
            auVar29[0xc] = 0xff;
            auVar29[0xd] = 0xff;
            auVar29[0xe] = 0xff;
            auVar29[0xf] = 0xff;
            auVar29 = auVar29 & auVar28;
            if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff) {
              LegacyDataSPKM::AddInactiveHDChain(this_00,(CHDChain *)&p_Var13[1]._M_right);
            }
          }
        }
      }
      local_1e8 = (_Any_data)0x0;
      local_1d0 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                  ::_M_invoke;
      local_1d8 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:703:9)>
                  ::_M_manager;
      LVar19 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::WATCHS_abi_cxx11_,
                           (LoadFunc *)&local_1e8);
      if (local_1d8 != (code *)0x0) {
        (*local_1d8)(&local_1e8,&local_1e8,__destroy_functor);
      }
      if ((int)DVar25 <= (int)LVar19.m_result) {
        DVar25 = LVar19.m_result;
      }
      local_208 = (_Any_data)0x0;
      local_1f0 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                  ::_M_invoke;
      local_1f8 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:717:9)>
                  ::_M_manager;
      LVar14 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::WATCHMETA_abi_cxx11_,
                           (LoadFunc *)&local_208);
      if (local_1f8 != (code *)0x0) {
        (*local_1f8)(&local_208,&local_208,__destroy_functor);
      }
      if ((int)DVar25 <= (int)LVar14.m_result) {
        DVar25 = LVar14.m_result;
      }
      local_228 = (_Any_data)0x0;
      local_210 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                  ::_M_invoke;
      local_218 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:729:9)>
                  ::_M_manager;
      LVar15 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::POOL_abi_cxx11_,
                           (LoadFunc *)&local_228);
      if (local_218 != (code *)0x0) {
        (*local_218)(&local_228,&local_228,__destroy_functor);
      }
      DVar11 = LVar15.m_result;
      if ((int)LVar15.m_result < (int)DVar25) {
        DVar11 = DVar25;
      }
      local_248 = (_Any_data)0x0;
      local_230 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                  ::_M_invoke;
      local_238 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:746:9)>
                  ::_M_manager;
      pwallet = pCVar30;
      LVar15 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::DEFAULTKEY_abi_cxx11_,
                           (LoadFunc *)&local_248);
      if (local_238 != (code *)0x0) {
        (*local_238)(&local_248,&local_248,__destroy_functor);
      }
      DVar25 = LVar15.m_result;
      if ((int)LVar15.m_result < (int)DVar11) {
        DVar25 = DVar11;
      }
      local_268 = (_Any_data)0x0;
      local_250 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                  ::_M_invoke;
      local_258 = std::
                  _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:764:9)>
                  ::_M_manager;
      LVar15 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::OLD_KEY_abi_cxx11_,
                           (LoadFunc *)&local_268);
      if (local_258 != (code *)0x0) {
        (*local_258)(&local_268,&local_268,__destroy_functor);
      }
      DVar11 = LVar15.m_result;
      if ((int)LVar15.m_result < (int)DVar25) {
        DVar11 = DVar25;
      }
      if ((int)DVar11 < 5) {
        iVar10 = parameters_1 + LVar18.m_records;
        CWallet::WalletLogPrintf<int,int,int,int>
                  (pCVar30,
                   "Legacy Wallet Keys: %u plaintext, %u encrypted, %u w/ metadata, %u total.\n",
                   LVar18.m_records,parameters_1,LVar17.m_records,iVar10);
        bVar9 = CWallet::IsLegacy(pCVar30);
        if (((bVar9) && (iVar10 + LVar19.m_records != LVar14.m_records + LVar17.m_records)) &&
           (this_01 = CWallet::GetLegacyScriptPubKeyMan(pCVar30),
           this_01 != (LegacyScriptPubKeyMan *)0x0)) {
          local_68[8] = 0;
          local_68._0_8_ =
               &(this_01->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore;
          std::unique_lock<std::recursive_mutex>::lock
                    ((unique_lock<std::recursive_mutex> *)local_68);
          LegacyScriptPubKeyMan::UpdateTimeFirstKey(this_01,1);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)local_68);
        }
      }
      std::
      _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
      ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                   *)local_a8);
    }
    DVar25 = LOAD_OK;
    if (0 < (int)DVar11) {
      DVar25 = DVar11;
    }
LAB_001ad216:
    _Var31._M_head_impl =
         (pWVar32->m_batch)._M_t.
         super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>.
         _M_t.
         super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
         .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
    local_68._0_4_ = local_28c;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = local_118._4_12_;
    local_118 = auVar6 << 0x20;
    local_c8[0] = (long *)((ulong)local_c8[0] & 0xffffffff00000000);
    auStack_a0 = (undefined1  [8])0x0;
    pvVar16 = operator_new(0x20);
    *(DatabaseBatch **)pvVar16 = _Var31._M_head_impl;
    *(undefined1 **)((long)pvVar16 + 8) = local_118;
    *(long ***)((long)pvVar16 + 0x10) = local_c8;
    *(undefined1 **)((long)pvVar16 + 0x18) = local_68;
    local_a8 = (undefined1  [8])pvVar16;
    local_98._8_8_ =
         std::
         _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
         ::_M_invoke;
    local_98._0_8_ =
         std::
         _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:804:9)>
         ::_M_manager;
    pCVar30 = pwallet;
    LVar17 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::WALLETDESCRIPTOR_abi_cxx11_,
                         (LoadFunc *)local_a8);
    if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
      (*(code *)local_98._0_8_)(local_a8,local_a8,3);
    }
    DVar11 = LVar17.m_result;
    if ((int)DVar11 < 5) {
      CWallet::WalletLogPrintf<int,int,int,int>
                (pwallet,"Descriptors: %u, Descriptor Keys: %u plaintext, %u encrypted, %u total.\n"
                 ,LVar17.m_records,local_118._0_4_,(int)local_c8[0],
                 (int)local_c8[0] + local_118._0_4_);
    }
    if ((int)DVar25 <= (int)DVar11) {
      DVar25 = DVar11;
    }
    DVar11 = UNKNOWN_DESCRIPTOR;
    if (DVar25 != UNKNOWN_DESCRIPTOR) {
      _Var31._M_head_impl =
           (pWVar32->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      _local_a8 = (_Any_data)0x0;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:974:9)>
           ::_M_manager;
      LVar17 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::NAME_abi_cxx11_,
                           (LoadFunc *)local_a8);
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      local_68 = (undefined1  [16])0x0;
      local_58._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
           ::_M_invoke;
      local_58._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:986:9)>
           ::_M_manager;
      LVar18 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::PURPOSE_abi_cxx11_,
                           (LoadFunc *)local_68);
      if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_58._0_8_)(local_68,local_68,3);
      }
      local_118 = (undefined1  [16])0x0;
      local_108._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
           ::_M_invoke;
      local_108._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1002:9)>
           ::_M_manager;
      LVar19 = LoadRecords(pwallet,_Var31._M_head_impl,(string *)&DBKeys::DESTDATA_abi_cxx11_,
                           (LoadFunc *)local_118);
      if ((_Manager_type)local_108._0_8_ != (_Manager_type)0x0) {
        (*(code *)local_108._0_8_)((_Any_data *)local_118,(_Any_data *)local_118,__destroy_functor);
      }
      DVar11 = LVar18.m_result;
      if ((int)LVar18.m_result < (int)LVar17.m_result) {
        DVar11 = LVar17.m_result;
      }
      if ((int)DVar11 <= (int)LVar19.m_result) {
        DVar11 = LVar19.m_result;
      }
      DVar22 = LOAD_OK;
      if (0 < (int)DVar11) {
        DVar22 = DVar11;
      }
      if (DVar22 <= DVar25) {
        DVar22 = DVar25;
      }
      _Var31._M_head_impl =
           (pWVar32->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      local_269 = '\0';
      auStack_a0 = (undefined1  [8])local_288;
      local_a8 = (undefined1  [8])&local_269;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1036:9)>
           ::_M_manager;
      pWVar33 = pWVar32;
      LVar17 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::TX_abi_cxx11_,
                           (LoadFunc *)local_a8);
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      local_68 = (undefined1  [16])0x0;
      local_58._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
           ::_M_invoke;
      local_58._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1089:9)>
           ::_M_manager;
      LVar18 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::LOCKED_UTXO_abi_cxx11_,
                           (LoadFunc *)local_68);
      if ((_Base_ptr)local_58._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_58._0_8_)(local_68,local_68,3);
      }
      local_118 = (undefined1  [16])0x0;
      local_108._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
           ::_M_invoke;
      local_108._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1102:9)>
           ::_M_manager;
      LVar19 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)&DBKeys::ORDERPOSNEXT_abi_cxx11_,
                           (LoadFunc *)local_118);
      if ((_Manager_type)local_108._0_8_ != (_Manager_type)0x0) {
        (*(code *)local_108._0_8_)((_Any_data *)local_118,(_Any_data *)local_118,__destroy_functor);
      }
      DVar25 = LVar18.m_result;
      if ((int)LVar18.m_result < (int)LVar17.m_result) {
        DVar25 = LVar17.m_result;
      }
      if ((int)DVar25 <= (int)LVar19.m_result) {
        DVar25 = LVar19.m_result;
      }
      if ((int)DVar25 < 1) {
        DVar25 = LOAD_OK;
      }
      if (DVar25 <= DVar22) {
        DVar25 = DVar22;
      }
      uVar27 = (ulong)DVar25;
      _Var31._M_head_impl =
           (pWVar32->m_batch)._M_t.
           super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
           ._M_t.
           super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
           .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl;
      local_48 = (_Base_ptr)(local_68 + 8);
      local_68._8_4_ = 0;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_48;
      local_58 = auVar7 << 0x40;
      local_40 = 0;
      local_a8 = (undefined1  [8])local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_,
                 DAT_006c3010 + DBKeys::ACTIVEEXTERNALSPK_abi_cxx11_);
      p_Var13 = (_Rb_tree_node_base *)auStack_78;
      local_88 = p_Var13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,DBKeys::ACTIVEINTERNALSPK_abi_cxx11_,
                 DAT_006c3030 + DBKeys::ACTIVEINTERNALSPK_abi_cxx11_);
      lVar26 = 0;
      DVar25 = LOAD_OK;
      do {
        local_118._8_8_ = (string *)(local_a8 + lVar26);
        local_118._0_8_ = local_68;
        local_108._8_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
             ::_M_invoke;
        local_108._0_8_ =
             std::
             _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1125:13)>
             ::_M_manager;
        LVar17 = LoadRecords(pCVar30,_Var31._M_head_impl,(string *)(local_a8 + lVar26),
                             (LoadFunc *)local_118);
        if ((_Manager_type)local_108._0_8_ != (_Manager_type)0x0) {
          (*(code *)local_108._0_8_)
                    ((_Any_data *)local_118,(_Any_data *)local_118,__destroy_functor);
        }
        if ((int)DVar25 <= (int)LVar17.m_result) {
          DVar25 = LVar17.m_result;
        }
        lVar26 = lVar26 + 0x20;
      } while (lVar26 != 0x40);
      lVar26 = -0x40;
      pWVar32 = pWVar33;
      do {
        if (p_Var13 != p_Var13[-1]._M_left) {
          operator_delete(p_Var13[-1]._M_left,*(long *)p_Var13 + 1);
        }
        p_Var13 = p_Var13 + -1;
        lVar26 = lVar26 + 0x20;
      } while (lVar26 != 0);
      std::
      _Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<OutputType,_bool>,_std::pair<OutputType,_bool>,_std::_Identity<std::pair<OutputType,_bool>_>,_std::less<std::pair<OutputType,_bool>_>,_std::allocator<std::pair<OutputType,_bool>_>_>
                   *)local_68);
      DVar22 = (DBErrors)uVar27;
      if ((int)(DBErrors)uVar27 < (int)DVar25) {
        DVar22 = DVar25;
      }
      _local_a8 = (_Any_data)0x0;
      local_98._8_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
           ::_M_invoke;
      local_98._0_8_ =
           std::
           _Function_handler<wallet::DBErrors_(wallet::CWallet_*,_DataStream_&,_DataStream_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/walletdb.cpp:1151:9)>
           ::_M_manager;
      LVar17 = LoadRecords(pCVar30,(pWVar33->m_batch)._M_t.
                                   super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                                   .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>.
                                   _M_head_impl,(string *)&DBKeys::MASTER_KEY_abi_cxx11_,
                           (LoadFunc *)local_a8);
      if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)0x0) {
        (*(code *)local_98._0_8_)(local_a8,local_a8,3);
      }
      DVar11 = LVar17.m_result;
      if ((int)LVar17.m_result < (int)DVar22) {
        DVar11 = DVar22;
      }
      if (DVar11 == LOAD_OK) {
        uVar21 = local_288._8_8_;
        pWVar33 = pWVar32;
        if (local_288._0_8_ != local_288._8_8_) {
          __k = (key_type *)local_288._0_8_;
          do {
            iVar20 = std::
                     _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(pCVar30->mapWallet)._M_h,__k);
            if (iVar20.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
                _M_cur == (__node_type *)0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_001adf26;
              uVar21 = std::__throw_out_of_range("_Map_base::at");
              std::unique_lock<std::recursive_mutex>::~unique_lock
                        ((unique_lock<std::recursive_mutex> *)local_68);
              std::
              _Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
              ::~_Rb_tree((_Rb_tree<uint160,_std::pair<const_uint160,_wallet::CHDChain>,_std::_Select1st<std::pair<const_uint160,_wallet::CHDChain>_>,_std::less<uint160>,_std::allocator<std::pair<const_uint160,_wallet::CHDChain>_>_>
                           *)local_a8);
              __cxa_begin_catch(uVar21);
              DVar11 = CORRUPT;
              __cxa_end_catch();
              goto LAB_001ad7e1;
            }
            WriteTx(pWVar32,(CWalletTx *)
                            ((long)iVar20.
                                   super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                   ._M_cur + 0x28));
            __k = __k + 1;
          } while (__k != (key_type *)uVar21);
        }
        if ((bVar8 & local_28c == 0x46c6c) == 0) {
          DatabaseBatch::Write<std::__cxx11::string,int>
                    ((pWVar33->m_batch)._M_t.
                     super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                     .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &DBKeys::VERSION_abi_cxx11_,&CLIENT_VERSION,true);
        }
        DVar11 = LOAD_OK;
        if (local_269 == '\x01') {
          DVar11 = CWallet::ReorderTransactions(pCVar30);
        }
        CWallet::UpgradeKeyMetadata(pCVar30);
        CWallet::UpgradeDescriptorCache(pCVar30);
      }
    }
  }
LAB_001ad7e1:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_f8);
  if ((void *)local_288._0_8_ != (void *)0x0) {
    operator_delete((void *)local_288._0_8_,local_278 - local_288._0_8_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return DVar11;
  }
LAB_001adf26:
  __stack_chk_fail();
}

Assistant:

DBErrors WalletBatch::LoadWallet(CWallet* pwallet)
{
    DBErrors result = DBErrors::LOAD_OK;
    bool any_unordered = false;
    std::vector<uint256> upgraded_txs;

    LOCK(pwallet->cs_wallet);

    // Last client version to open this wallet
    int last_client = CLIENT_VERSION;
    bool has_last_client = m_batch->Read(DBKeys::VERSION, last_client);
    pwallet->WalletLogPrintf("Wallet file version = %d, last client version = %d\n", pwallet->GetVersion(), last_client);

    try {
        if ((result = LoadMinVersion(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

        // Load wallet flags, so they are known when processing other records.
        // The FLAGS key is absent during wallet creation.
        if ((result = LoadWalletFlags(pwallet, *m_batch)) != DBErrors::LOAD_OK) return result;

#ifndef ENABLE_EXTERNAL_SIGNER
        if (pwallet->IsWalletFlagSet(WALLET_FLAG_EXTERNAL_SIGNER)) {
            pwallet->WalletLogPrintf("Error: External signer wallet being loaded without external signer support compiled\n");
            return DBErrors::EXTERNAL_SIGNER_SUPPORT_REQUIRED;
        }
#endif

        // Load legacy wallet keys
        result = std::max(LoadLegacyWalletRecords(pwallet, *m_batch, last_client), result);

        // Load descriptors
        result = std::max(LoadDescriptorWalletRecords(pwallet, *m_batch, last_client), result);
        // Early return if there are unknown descriptors. Later loading of ACTIVEINTERNALSPK and ACTIVEEXTERNALEXPK
        // may reference the unknown descriptor's ID which can result in a misleading corruption error
        // when in reality the wallet is simply too new.
        if (result == DBErrors::UNKNOWN_DESCRIPTOR) return result;

        // Load address book
        result = std::max(LoadAddressBookRecords(pwallet, *m_batch), result);

        // Load tx records
        result = std::max(LoadTxRecords(pwallet, *m_batch, upgraded_txs, any_unordered), result);

        // Load SPKMs
        result = std::max(LoadActiveSPKMs(pwallet, *m_batch), result);

        // Load decryption keys
        result = std::max(LoadDecryptionKeys(pwallet, *m_batch), result);
    } catch (...) {
        // Exceptions that can be ignored or treated as non-critical are handled by the individual loading functions.
        // Any uncaught exceptions will be caught here and treated as critical.
        result = DBErrors::CORRUPT;
    }

    // Any wallet corruption at all: skip any rewriting or
    // upgrading, we don't want to make it worse.
    if (result != DBErrors::LOAD_OK)
        return result;

    for (const uint256& hash : upgraded_txs)
        WriteTx(pwallet->mapWallet.at(hash));

    if (!has_last_client || last_client != CLIENT_VERSION) // Update
        m_batch->Write(DBKeys::VERSION, CLIENT_VERSION);

    if (any_unordered)
        result = pwallet->ReorderTransactions();

    // Upgrade all of the wallet keymetadata to have the hd master key id
    // This operation is not atomic, but if it fails, updated entries are still backwards compatible with older software
    try {
        pwallet->UpgradeKeyMetadata();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    // Upgrade all of the descriptor caches to cache the last hardened xpub
    // This operation is not atomic, but if it fails, only new entries are added so it is backwards compatible
    try {
        pwallet->UpgradeDescriptorCache();
    } catch (...) {
        result = DBErrors::CORRUPT;
    }

    return result;
}